

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Status::Status(Status *this,StatusCode code,string_view msg)

{
  string_view message_arg;
  StatusCode code_arg;
  bool bVar1;
  uintptr_t uVar2;
  StatusRep *this_00;
  unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
  local_40;
  Status *local_38;
  char *pcStack_30;
  StatusCode local_24;
  Status *pSStack_20;
  StatusCode code_local;
  Status *this_local;
  string_view msg_local;
  
  msg_local._M_len = (size_t)msg._M_str;
  this_local = (Status *)msg._M_len;
  local_24 = code;
  pSStack_20 = this;
  uVar2 = CodeToInlinedRep(code);
  this->rep_ = uVar2;
  if (local_24 != kOk) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (!bVar1) {
      this_00 = (StatusRep *)operator_new(0x30);
      code_arg = local_24;
      local_38 = this_local;
      pcStack_30 = (char *)msg_local._M_len;
      std::
      unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>,std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>>>
      ::
      unique_ptr<std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>>,void>
                ((unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>,std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>>>
                  *)&local_40,(nullptr_t)0x0);
      message_arg._M_str = pcStack_30;
      message_arg._M_len = (size_t)local_38;
      status_internal::StatusRep::StatusRep(this_00,code_arg,message_arg,&local_40);
      uVar2 = PointerToRep(this_00);
      this->rep_ = uVar2;
      std::
      unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      ::~unique_ptr(&local_40);
    }
  }
  return;
}

Assistant:

Status::Status(absl::StatusCode code, absl::string_view msg)
    : rep_(CodeToInlinedRep(code)) {
  if (code != absl::StatusCode::kOk && !msg.empty()) {
    rep_ = PointerToRep(new status_internal::StatusRep(code, msg, nullptr));
  }
}